

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_FormatInt_Test::TestBody(FormatterTest_FormatInt_Test *this)

{
  bool bVar1;
  int *in_RCX;
  char *message;
  AssertHelper local_70;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"missing \'}\' in format string",
               (allocator *)&local_70);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_70.data_._0_4_ = 0x2a;
      fmt::v5::format<char[5],int>(&local_38,(v5 *)"{0:v",(char (*) [5])&local_70,in_RCX);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [100])
               "Expected: format(\"{0:v\", 42) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x544,message);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_expected_message._M_dataplus._M_p._0_4_ = 0x2a;
  check_unknown_types<int>((int *)&gtest_expected_message,"bBdoxXn","integer");
  return;
}

Assistant:

TEST(FormatterTest, FormatInt) {
  EXPECT_THROW_MSG(format("{0:v", 42),
      format_error, "missing '}' in format string");
  check_unknown_types(42, "bBdoxXn", "integer");
}